

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::IsSubSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *sub_symbol,
          string *super_symbol)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(sub_symbol,super_symbol);
  bVar2 = true;
  if (!_Var1) {
    bVar2 = HasPrefixString(super_symbol,sub_symbol);
    if (bVar2) {
      bVar2 = (super_symbol->_M_dataplus)._M_p[sub_symbol->_M_string_length] == '.';
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::IsSubSymbol(
    const string& sub_symbol, const string& super_symbol) {
  return sub_symbol == super_symbol ||
         (HasPrefixString(super_symbol, sub_symbol) &&
             super_symbol[sub_symbol.size()] == '.');
}